

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsReadOnlyLoad(Instruction *this)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  int iVar4;
  Instruction *this_00;
  IRContext *this_01;
  TypeManager *this_02;
  Type *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Image *image_type;
  Type *address_type;
  Instruction *address_def;
  Instruction *this_local;
  
  bVar1 = IsLoad(this);
  if (bVar1) {
    this_00 = GetBaseAddress(this);
    if (this_00 == (Instruction *)0x0) {
      return false;
    }
    OVar2 = opcode(this_00);
    if ((OVar2 == OpVariable) && (bVar1 = IsReadOnlyPointer(this_00), bVar1)) {
      return true;
    }
    OVar2 = opcode(this_00);
    if (OVar2 == OpLoad) {
      this_01 = context(this);
      this_02 = IRContext::get_type_mgr(this_01);
      uVar3 = type_id(this_00);
      pTVar5 = analysis::TypeManager::GetType(this_02,uVar3);
      iVar4 = (*pTVar5->_vptr_Type[0x16])();
      if (CONCAT44(extraout_var,iVar4) != 0) {
        iVar4 = (*pTVar5->_vptr_Type[0x16])();
        pTVar5 = analysis::SampledImage::image_type((SampledImage *)CONCAT44(extraout_var_00,iVar4))
        ;
        iVar4 = (*pTVar5->_vptr_Type[0x12])();
        uVar3 = analysis::Image::sampled((Image *)CONCAT44(extraout_var_01,iVar4));
        if (uVar3 == 1) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Instruction::IsReadOnlyLoad() const {
  if (IsLoad()) {
    Instruction* address_def = GetBaseAddress();
    if (!address_def) {
      return false;
    }

    if (address_def->opcode() == spv::Op::OpVariable) {
      if (address_def->IsReadOnlyPointer()) {
        return true;
      }
    }

    if (address_def->opcode() == spv::Op::OpLoad) {
      const analysis::Type* address_type =
          context()->get_type_mgr()->GetType(address_def->type_id());
      if (address_type->AsSampledImage() != nullptr) {
        const auto* image_type =
            address_type->AsSampledImage()->image_type()->AsImage();
        if (image_type->sampled() == 1) {
          return true;
        }
      }
    }
  }
  return false;
}